

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ReleaseTempReg(Parse *pParse,int iReg)

{
  byte bVar1;
  long lVar2;
  
  if (iReg != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      if (pParse->nColCache != 0) {
        lVar2 = 0;
        do {
          if (*(int *)((long)&pParse->aColCache[0].iReg + lVar2) == iReg) {
            (&pParse->aColCache[0].tempReg)[lVar2] = '\x01';
            return;
          }
          lVar2 = lVar2 + 0x14;
        } while ((uint)pParse->nColCache * 0x14 != (int)lVar2);
      }
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = iReg;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ReleaseTempReg(Parse *pParse, int iReg){
  if( iReg && pParse->nTempReg<ArraySize(pParse->aTempReg) ){
    int i;
    struct yColCache *p;
    for(i=0, p=pParse->aColCache; i<pParse->nColCache; i++, p++){
      if( p->iReg==iReg ){
        p->tempReg = 1;
        return;
      }
    }
    pParse->aTempReg[pParse->nTempReg++] = iReg;
  }
}